

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r6p_1lin.cpp
# Opt level: O1

int r6pSingleLin(MatrixXd *X,MatrixXd *u,MatrixXd *ud,int direction,double r0,int maxpow,
                RSSinglelinCameraPoseVector *results)

{
  double dVar1;
  double dVar2;
  undefined8 uVar3;
  uint uVar4;
  PointerType ptr;
  double *pdVar5;
  undefined1 *puVar6;
  double *pdVar7;
  undefined8 *puVar8;
  uint uVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  uint uVar13;
  int k;
  double *pdVar14;
  double *pdVar15;
  DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  *other;
  Index IVar16;
  PartialPivLU<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *p_00;
  void *pvVar17;
  bool bVar18;
  double pivtol;
  double dVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  int iVar22;
  undefined1 auVar23 [16];
  long lVar24;
  int nroots;
  VectorXd b;
  VectorXd coeffs;
  MatrixXd RR;
  MatrixXd A;
  MatrixXd alpha;
  MatrixXd CC;
  SrcEvaluatorType srcEvaluator_1;
  MatrixXd AM;
  SrcEvaluatorType srcEvaluator;
  MatrixXcd sols;
  DstEvaluatorType dstEvaluator;
  MatrixXd C1;
  MatrixXd C0;
  Matrix3d R;
  type tmp;
  AngleAxis<double> eaxn;
  Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> data;
  VectorXd wCt;
  double p [65];
  double proots [65];
  double roots [64];
  double solver_input [2475];
  int local_5910;
  assign_op<double,_double> local_5909;
  void *local_5908;
  MatrixXd *local_5900;
  Matrix<double,__1,_1,_0,__1,_1> local_58f8;
  DenseStorage<double,__1,__1,_1,_0> local_58e8;
  double local_58d8;
  MatrixXd *local_58d0;
  DenseStorage<double,__1,__1,__1,_0> local_58c8;
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>,_Eigen::internal::assign_op<double,_double>,_0>
  local_58a8;
  DenseStorage<double,__1,__1,__1,_0> local_5888;
  DenseStorage<double,__1,__1,__1,_0> local_5868;
  double *local_5848;
  long local_5840;
  long local_5838;
  plainobjectbase_evaluator_data<double,_3> local_5830;
  DenseStorage<double,__1,__1,__1,_0> local_5828;
  DstXprType local_5808;
  SrcXprType local_57c8;
  double local_57b8;
  RSSinglelinCameraPose *pRStack_57b0;
  double local_57a8;
  double dStack_57a0;
  double local_5798;
  double dStack_5790;
  double local_5788;
  double local_5778;
  undefined8 uStack_5770;
  RSSinglelinCameraPoseVector *local_5760;
  long local_5758;
  long local_5750;
  DenseStorage<std::complex<double>,__1,__1,__1,_0> local_5748;
  DstEvaluatorType local_5730;
  Vector3d local_5718;
  Vector3d local_5700;
  DenseStorage<double,__1,__1,__1,_0> local_56e8;
  DenseStorage<double,__1,__1,__1,_0> local_56d0;
  void *local_56b8 [2];
  long local_56a8;
  void *local_56a0;
  double adStack_5698 [2];
  double local_5688 [4];
  double dStack_5668;
  double local_5660;
  double local_5658;
  double dStack_5650;
  double local_5648 [2];
  RSSinglelinCameraPose local_5638 [2];
  void *local_5558;
  double dStack_5550;
  double local_5548;
  undefined8 uStack_5540;
  Vector3d local_5538;
  AngleAxis<double> local_5518;
  DenseStorage<double,__1,__1,_1,_0> local_54f8;
  DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  *local_54e8;
  undefined8 local_54e0;
  double local_54d8 [2];
  RSSinglelinCameraPose local_54c8;
  undefined8 local_5458;
  undefined8 uStack_5450;
  undefined8 local_5448;
  undefined8 local_5440;
  double local_5438;
  double local_5430;
  double local_5428;
  double local_5420;
  double local_5418;
  double local_5410;
  double local_5408;
  double local_5400;
  double local_53f8;
  undefined1 local_53e8 [16];
  undefined1 local_53d8 [16];
  MatrixXd local_53c0;
  PartialPivLU<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> local_53a8 [7];
  SrcXprType local_5198 [33];
  assign_op<double,_double> local_4f88 [512];
  double local_4d88 [15];
  undefined1 local_4d10 [19680];
  
  local_58e8.m_data = (double *)0x0;
  local_58e8.m_rows = 0;
  local_5900 = u;
  local_58d8 = r0;
  local_58d0 = X;
  local_5760 = results;
  free((void *)0x0);
  pdVar5 = (double *)malloc(0x2760);
  if (pdVar5 == (double *)0x0) {
    puVar8 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar8 = srand;
    __cxa_throw(puVar8,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  local_58e8.m_rows = 0x4ec;
  other = (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
           *)local_4d88;
  local_4d88[0] = 4.89124989382834e-322;
  local_4d88[1] = 8.05327002721232e-322;
  local_4d88[2] = 0.0;
  local_58e8.m_data = pdVar5;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_5848,other);
  pdVar5 = (local_58d0->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
           m_data;
  pdVar7 = (local_5900->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
           m_data;
  pdVar14 = (ud->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_data;
  if (direction == 0) {
    R6P_cayley_linearized_prepare_data_C(pdVar5,pdVar7,pdVar14,local_58d8,local_4d88);
  }
  else {
    R6P_cayley_linearized_prepare_data_y_C(pdVar5,pdVar7,pdVar14,local_58d8,local_4d88);
  }
  local_54e8 = other;
  local_54e0 = 0xf;
  local_54d8[0] = 8.15208315638057e-322;
  puVar6 = local_4d10;
  lVar10 = 0;
  do {
    dVar19 = ABS(local_4d88[lVar10]);
    lVar12 = 0;
    do {
      dVar19 = dVar19 + ABS(*(double *)(puVar6 + lVar12));
      lVar12 = lVar12 + 0x78;
    } while (lVar12 != 0x4ce0);
    lVar12 = 0;
    do {
      *(double *)(other + lVar12) = *(double *)(other + lVar12) / (dVar19 / 165.0);
      lVar12 = lVar12 + 0x78;
    } while (lVar12 != 0x4d58);
    lVar10 = lVar10 + 1;
    puVar6 = puVar6 + 8;
    other = other + 8;
  } while (lVar10 != 0xf);
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::Map<Eigen::Matrix<double,_1,_1,0,_1,_1>,0,Eigen::Stride<0,0>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_53c0,
             (DenseBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
              *)&local_54e8);
  computeCoeffs(&local_53c0,(VectorXd *)&local_58e8);
  free(local_53c0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data)
  ;
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage(&local_54f8,&local_58e8);
  lVar10 = 0;
  do {
    local_5848[*(int *)((long)setupEliminationTemplate::iv1 + lVar10)] =
         local_54f8.m_data[*(int *)((long)setupEliminationTemplate::iv2 + lVar10)];
    lVar10 = lVar10 + 4;
  } while (lVar10 != 0x81f0);
  free(local_54f8.m_data);
  local_53a8[0].m_lu.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
  m_data = local_5848;
  local_53a8[0].m_lu.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
  m_rows = local_5840;
  local_53a8[0].m_lu.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
  m_cols = 99;
  local_53a8[0].m_p.m_indices.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
  m_rows = 0;
  local_53a8[0].m_rowsTranspositions.m_indices.
  super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_data = (int *)0x0;
  local_53a8[0].m_rowsTranspositions.m_indices.
  super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows = local_5840;
  local_53a8[0].m_p.m_indices.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
  m_data = (int *)&local_5848;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,true>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_56a0,
             (DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_true>_> *)
             local_53a8);
  local_53a8[0].m_rowsTranspositions.m_indices.
  super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (int *)(local_5838 + -0x40);
  local_53a8[0].m_lu.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
  m_data = local_5848 +
           local_5840 *
           (long)local_53a8[0].m_rowsTranspositions.m_indices.
                 super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_data;
  local_53a8[0].m_lu.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
  m_rows = local_5840;
  local_53a8[0].m_lu.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
  m_cols = 0x40;
  local_53a8[0].m_p.m_indices.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
  m_rows = 0;
  local_53a8[0].m_rowsTranspositions.m_indices.
  super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows = local_5840;
  local_53a8[0].m_p.m_indices.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
  m_data = (int *)&local_5848;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,true>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_56b8,
             (DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_true>_> *)
             local_53a8);
  Eigen::PartialPivLU<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PartialPivLU<Eigen::Matrix<double,_1,_1,0,_1,_1>>
            ((PartialPivLU<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_53a8,
             (EigenBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_56a0);
  local_5868.m_data = (double *)0x0;
  local_5868.m_rows = 0;
  local_5868.m_cols = 0;
  local_5198[0].m_dec = local_53a8;
  local_5198[0].m_rhs = (Matrix<double,__1,__1,_0,__1,__1> *)local_56b8;
  if ((local_56a8 != 0 &&
       local_53a8[0].m_lu.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
       .m_cols != 0) &&
     (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / SEXT816(local_56a8),0) <
      local_53a8[0].m_lu.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
      m_cols)) {
    puVar8 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar8 = srand;
    __cxa_throw(puVar8,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
            (&local_5868,
             local_56a8 *
             local_53a8[0].m_lu.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
             m_storage.m_cols,
             local_53a8[0].m_lu.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
             m_storage.m_cols,local_56a8);
  Eigen::internal::
  Assignment<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Solve<Eigen::PartialPivLU<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
  ::run((Matrix<double,__1,__1,_0,__1,__1> *)&local_5868,local_5198,local_4f88);
  free(local_53a8[0].m_rowsTranspositions.m_indices.
       super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  free(local_53a8[0].m_p.m_indices.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
       m_storage.m_data);
  free(local_53a8[0].m_lu.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
       .m_data);
  local_58c8.m_data = (double *)0x0;
  local_58c8.m_rows = 0;
  local_58c8.m_cols = 0;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_58c8,0x1540,0x55,0x40);
  pdVar7 = local_5868.m_data + 0x4e;
  lVar10 = 0;
  pdVar5 = local_58c8.m_data;
  do {
    pdVar14 = pdVar5;
    pdVar15 = pdVar7;
    lVar12 = local_58c8.m_cols;
    if (0 < local_58c8.m_cols) {
      do {
        *pdVar14 = -*pdVar15;
        lVar12 = lVar12 + -1;
        pdVar14 = pdVar14 + local_58c8.m_rows;
        pdVar15 = pdVar15 + local_5868.m_rows;
      } while (lVar12 != 0);
    }
    auVar20 = _DAT_00596480;
    lVar10 = lVar10 + 1;
    pdVar7 = pdVar7 + 1;
    pdVar5 = pdVar5 + 1;
  } while (lVar10 != 0x15);
  if (0 < local_58c8.m_cols) {
    lVar10 = 0;
    pdVar5 = local_58c8.m_data;
    do {
      pdVar5 = pdVar5 + local_58c8.m_rows;
      iVar22 = (int)((ulong)lVar10 >> 0x20);
      lVar12 = -0x40;
      auVar23 = auVar20;
      do {
        lVar24 = auVar23._8_8_;
        pdVar7 = pdVar5 + lVar12;
        *(undefined4 *)pdVar7 = 0;
        *(uint *)((long)pdVar7 + 4) =
             -(uint)(auVar23._0_4_ == (int)lVar10 && auVar23._4_4_ == iVar22) & 0x3ff00000;
        *(undefined4 *)(pdVar7 + 1) = 0;
        *(uint *)((long)pdVar7 + 0xc) =
             -(uint)(auVar23._8_4_ == (int)lVar10 && auVar23._12_4_ == iVar22) & 0x3ff00000;
        auVar23._0_8_ = auVar23._0_8_ + 2;
        auVar23._8_8_ = lVar24 + 2;
        lVar12 = lVar12 + 2;
      } while (lVar12 != 0);
      lVar10 = lVar10 + 1;
    } while (lVar10 != local_58c8.m_cols);
  }
  local_5828.m_data = (double *)0x0;
  local_5828.m_rows = 0;
  local_5828.m_cols = 0;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_5828,0x1000,0x40,0x40);
  lVar10 = 0;
  pdVar5 = local_5828.m_data;
  do {
    if (0 < local_5828.m_cols) {
      pdVar7 = local_58c8.m_data + (int)(&DAT_005a6b40)[lVar10];
      pdVar14 = pdVar5;
      IVar16 = local_5828.m_cols;
      do {
        *pdVar14 = *pdVar7;
        pdVar7 = pdVar7 + local_58c8.m_rows;
        pdVar14 = pdVar14 + local_5828.m_rows;
        IVar16 = IVar16 + -1;
      } while (IVar16 != 0);
    }
    lVar10 = lVar10 + 1;
    pdVar5 = pdVar5 + 1;
  } while (lVar10 != 0x40);
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage(&local_56d0,&local_5828);
  p_00 = local_53a8;
  charpoly_danilevsky((MatrixXd *)&local_56d0,(double (*) [65])p_00,pivtol);
  free(local_56d0.m_data);
  lVar10 = 0x40;
  do {
    (&local_5198[0].m_dec)[lVar10] =
         (PartialPivLU<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
         (p_00->m_lu).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
         m_data;
    p_00 = (PartialPivLU<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
           &(p_00->m_lu).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
            m_rows;
    bVar18 = lVar10 != 0;
    lVar10 = lVar10 + -1;
  } while (bVar18);
  find_real_roots_sturm((double *)local_5198,0x40,(double *)local_4f88,&local_5910,maxpow,false);
  local_5748.m_data = (complex<double> *)0x0;
  local_5748.m_rows = 0;
  local_5748.m_cols = 0;
  lVar10 = (long)local_5910;
  if ((lVar10 != 0) &&
     (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / SEXT816(lVar10),0) < 3)) {
    puVar8 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar8 = srand;
    __cxa_throw(puVar8,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  Eigen::DenseStorage<std::complex<double>,_-1,_-1,_-1,_0>::resize(&local_5748,lVar10 * 3,3,lVar10);
  iVar22 = local_5910;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage(&local_56e8,&local_5828);
  solve_xy_from_AM((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                    *)local_5638,(double *)local_4f88,iVar22,(MatrixXd *)&local_56e8);
  pvVar17 = (void *)local_5638[0].v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                    m_storage.m_data.array[0];
  local_5638[0].v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
  array[0] = 0.0;
  local_5638[0].v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
  array[1] = 0.0;
  local_5638[0].v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
  array[2] = 0.0;
  free(local_56e8.m_data);
  if (0 < local_5910) {
    local_5750 = (long)direction;
    lVar10 = 0;
    local_5908 = pvVar17;
    do {
      dVar19 = *(double *)((long)pvVar17 + lVar10 * 0x18);
      local_53e8._8_8_ = dVar19;
      local_53e8._0_8_ = 0x3ff0000000000000;
      local_53d8 = *(undefined1 (*) [16])((long)pvVar17 + lVar10 * 0x18 + 8);
      auVar20._0_8_ =
           local_53d8._8_8_ * local_53d8._8_8_ + dVar19 * dVar19 +
           local_53d8._0_8_ * local_53d8._0_8_ + 1.0;
      if (0.0 < auVar20._0_8_) {
        auVar20._8_8_ = 0;
        auVar20 = sqrtpd(auVar20,auVar20);
        auVar21._0_8_ = auVar20._0_8_;
        auVar21._8_8_ = auVar21._0_8_;
        local_53e8 = divpd(local_53e8,auVar21);
        local_53d8 = divpd(local_53d8,auVar21);
      }
      quat2R((Vector4d *)local_53e8,(Matrix3d *)local_5688);
      Eigen::AngleAxis<double>::operator=
                (&local_5518,(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)local_5688);
      local_5558 = (void *)(local_5518.m_angle *
                           local_5518.m_axis.
                           super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                           m_data.array[0]);
      dStack_5550 = local_5518.m_angle *
                    local_5518.m_axis.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                    m_storage.m_data.array[1];
      local_5548 = local_5518.m_angle *
                   local_5518.m_axis.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                   m_storage.m_data.array[2];
      uStack_5540 = 0;
      local_5888.m_data = (double *)0x0;
      local_5888.m_rows = 0;
      local_5888.m_cols = 0;
      Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_5888,0xa2,0x12,9);
      local_58f8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
           (double *)0x0;
      local_58f8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0
      ;
      local_5758 = lVar10;
      free((void *)0x0);
      pdVar5 = (double *)malloc(0x90);
      if (pdVar5 == (double *)0x0) {
        puVar8 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar8 = srand;
        __cxa_throw(puVar8,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
      }
      local_58f8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
           0x12;
      lVar10 = 0;
      local_58f8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
           pdVar5;
      do {
        local_5778 = (local_5900->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                     m_storage.m_data[lVar10 * 2 + local_5750];
        uStack_5770 = 0;
        pdVar5 = (local_58d0->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                 m_storage.m_data;
        dVar19 = pdVar5[lVar10 * 3 + 2];
        pdVar5 = pdVar5 + lVar10 * 3;
        dVar1 = *pdVar5;
        dVar2 = pdVar5[1];
        local_5538.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
        array[0] = dVar2 * local_5688[3] + dVar1 * local_5688[0] + dVar19 * local_5658;
        local_5538.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
        array[1] = dVar2 * dStack_5668 + dVar1 * local_5688[1] + dVar19 * dStack_5650;
        local_5538.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
        array[2] = local_5660 * dVar2 + dVar19 * local_5648[0] + local_5688[2] * dVar1;
        X_(&local_5538);
        local_5778 = local_5778 - local_58d8;
        local_5808.
        super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.
        m_rows.m_value = (long)-local_5778;
        local_57c8.m_rhs = (Matrix<double,__1,_1,_0,__1,_1> *)0x3;
        local_57b8 = 1.48219693752374e-323;
        local_57a8 = 0.0;
        dStack_57a0 = 0.0;
        local_5798 = 1.48219693752374e-323;
        local_58a8.m_dst = &local_5730;
        local_58a8.m_src = (SrcEvaluatorType *)&local_5808;
        local_58a8.m_functor = (assign_op<double,_double> *)&local_5830;
        local_58a8.m_dstExpr = (DstXprType *)&local_57c8;
        local_5808.
        super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.m_xpr =
             (XprTypeNested)local_5638;
        local_57c8.m_dec = (HouseholderQR<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_54c8;
        pRStack_57b0 = &local_54c8;
        local_5730.
        super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
        super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
        .m_data = (PointerType)&local_54c8;
        Eigen::internal::
        dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_3,_9,_0,_3,_9>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_Eigen::internal::assign_op<double,_double>,_0>,_4,_0>
        ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_3,_9,_0,_3,_9>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
               *)&local_58a8);
        local_54c8.t.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
        array[0] = 1.0;
        local_54c8.f = 0.0;
        local_54c8.t.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
        array[1] = 0.0;
        local_54c8.t.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
        array[2] = 0.0;
        local_54c8.rd = 1.0;
        local_5448 = 0;
        local_5458 = 0;
        uStack_5450 = 0;
        local_5440 = 0x3ff0000000000000;
        local_5438 = local_5778;
        local_5430 = local_5778 * 0.0;
        local_5418 = local_5778;
        local_53f8 = local_5778;
        pdVar5 = (local_5900->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                 m_storage.m_data;
        local_5700.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
        array[0] = pdVar5[lVar10 * 2];
        local_5700.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
        array[1] = pdVar5[lVar10 * 2 + 1];
        local_5700.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
        array[2] = 1.0;
        local_5428 = local_5430;
        local_5420 = local_5430;
        local_5410 = local_5430;
        local_5408 = local_5430;
        local_5400 = local_5430;
        X_(&local_5700);
        local_5730.
        super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
        super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
        .m_data = local_5888.m_data + lVar10 * 3;
        local_5808.
        super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.
        m_data = local_5730.
                 super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                 .
                 super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                 .m_data;
        local_5808.
        super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.
        m_rows.m_value = 3;
        local_5808.
        super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.
        m_cols.m_value = 9;
        local_5808.
        super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.m_xpr =
             (XprTypeNested)&local_5888;
        local_5808.
        super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
        m_startRow.m_value = lVar10 * 3;
        local_5808.
        super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
        m_startCol.m_value = 0;
        local_5808.
        super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
        m_outerStride = local_5888.m_rows;
        lVar12 = 0x10;
        do {
          dVar19 = *(double *)
                    ((long)local_54c8.v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                           .m_storage.m_data.array + lVar12);
          dVar1 = *(double *)((long)local_54d8 + lVar12);
          dVar2 = *(double *)((long)local_54d8 + lVar12 + 8);
          *(double *)((long)local_5648 + lVar12) =
               dVar2 * (double)pRStack_57b0 + dVar1 * (double)local_57c8.m_dec + dVar19 * local_5798
          ;
          *(double *)((long)local_5648 + lVar12 + 8) =
               dVar2 * local_57a8 + dVar1 * (double)local_57c8.m_rhs + dVar19 * dStack_5790;
          *(double *)
           ((long)local_5638[0].v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                  m_storage.m_data.array + lVar12) =
               dVar2 * dStack_57a0 + dVar19 * local_5788 + dVar1 * local_57b8;
          lVar12 = lVar12 + 0x18;
        } while (lVar12 != 0xe8);
        local_5730.
        super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
        super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
        .m_outerStride.m_value = local_5888.m_rows;
        local_58a8.m_dst = &local_5730;
        local_58a8.m_src = (SrcEvaluatorType *)&local_5830;
        local_58a8.m_functor = &local_5909;
        local_58a8.m_dstExpr = &local_5808;
        local_5830.data = (double *)local_5638;
        Eigen::internal::
        dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>,_Eigen::internal::assign_op<double,_double>,_0>,_4,_0>
        ::run(&local_58a8);
        pdVar5 = (local_5900->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                 m_storage.m_data;
        local_5718.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
        array[0] = pdVar5[lVar10 * 2];
        local_5718.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
        array[1] = pdVar5[lVar10 * 2 | 1];
        local_5718.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
        array[2] = 1.0;
        X_(&local_5718);
        pdVar5 = (local_58d0->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                 m_storage.m_data;
        local_58a8.m_dst = (DstEvaluatorType *)pdVar5[lVar10 * 3];
        local_58a8.m_src = (SrcEvaluatorType *)pdVar5[lVar10 * 3 + 1];
        local_58a8.m_functor = (assign_op<double,_double> *)pdVar5[lVar10 * 3 + 2];
        lVar12 = 0x10;
        do {
          dVar19 = *(double *)((long)local_5688 + lVar12);
          dVar1 = *(double *)((long)adStack_5698 + lVar12);
          dVar2 = *(double *)((long)adStack_5698 + lVar12 + 8);
          *(double *)((long)local_5648 + lVar12) =
               dVar2 * -(double)pRStack_57b0 + dVar1 * -(double)local_57c8.m_dec +
               dVar19 * -local_5798;
          *(double *)((long)local_5648 + lVar12 + 8) =
               dVar2 * -local_57a8 + dVar1 * -(double)local_57c8.m_rhs + dVar19 * -dStack_5790;
          *(double *)
           ((long)local_5638[0].v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                  m_storage.m_data.array + lVar12) =
               (dVar19 * -local_5788 - dVar2 * dStack_57a0) - dVar1 * local_57b8;
          lVar12 = lVar12 + 0x18;
        } while (lVar12 != 0x58);
        pdVar5 = local_58f8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
                 .m_data + lVar10 * 3;
        local_5808.
        super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.
        m_data = (PointerType)
                 ((double)local_58a8.m_functor *
                  local_5638[0].w.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                  m_storage.m_data.array[0] +
                 (double)local_58a8.m_src *
                 local_5638[0].C.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                 m_storage.m_data.array[0] +
                 (double)local_58a8.m_dst *
                 local_5638[0].v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                 m_storage.m_data.array[0]);
        local_5808.
        super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.
        m_rows.m_value =
             (long)((double)local_58a8.m_functor *
                    local_5638[0].w.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                    m_storage.m_data.array[1] +
                   (double)local_58a8.m_src *
                   local_5638[0].C.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                   m_storage.m_data.array[1] +
                   (double)local_58a8.m_dst *
                   local_5638[0].v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                   m_storage.m_data.array[1]);
        local_5808.
        super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.
        m_cols.m_value =
             (long)((double)local_58a8.m_functor *
                    local_5638[0].w.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                    m_storage.m_data.array[2] +
                    (double)local_58a8.m_src *
                    local_5638[0].C.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                    m_storage.m_data.array[2] +
                   (double)local_58a8.m_dst *
                   local_5638[0].v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                   m_storage.m_data.array[2]);
        uVar13 = (uint)((ulong)pdVar5 >> 3) & 1;
        if (((ulong)pdVar5 & 7) != 0) {
          uVar13 = 3;
        }
        if (uVar13 != 0) {
          memcpy(pdVar5,&local_5808,(ulong)(uVar13 * 8));
        }
        uVar4 = uVar13 ^ 3;
        if (1 < uVar4) {
          uVar11 = (ulong)(uVar13 * 8);
          uVar3 = *(undefined8 *)
                   ((long)&local_5808.
                           super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
                           .
                           super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                           .
                           super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>
                           .
                           super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>
                           .m_rows + uVar11);
          *(undefined8 *)((long)pdVar5 + uVar11) =
               *(undefined8 *)
                ((long)&local_5808.
                        super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
                        .
                        super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                        .
                        super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>
                        .
                        super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>
                        .m_data + uVar11);
          ((undefined8 *)((long)pdVar5 + uVar11))[1] = uVar3;
        }
        uVar9 = (uVar4 & 0xfffffffe) + uVar13;
        if (uVar9 < 3) {
          uVar11 = (ulong)((uVar13 + (uVar4 & 0xfffffffe)) * 8);
          memcpy((void *)((long)pdVar5 + uVar11),
                 (void *)((long)&local_5808.
                                 super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
                                 .
                                 super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                                 .
                                 super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>
                                 .
                                 super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>
                                 .m_data + uVar11),0x18 - (ulong)(uVar9 * 8));
        }
        lVar10 = lVar10 + 1;
      } while (lVar10 != 6);
      Eigen::HouseholderQR<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
      HouseholderQR<Eigen::Matrix<double,_1,_1,0,_1,_1>>
                ((HouseholderQR<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_5638,
                 (EigenBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_5888);
      pvVar17 = local_5908;
      local_57c8.m_rhs = &local_58f8;
      local_54c8.v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
      array[0] = 0.0;
      local_54c8.v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
      array[1] = 0.0;
      local_57c8.m_dec = (HouseholderQR<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_5638;
      Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_54c8,
                 (Index)local_5638[0].v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                        .m_storage.m_data.array[2],1);
      lVar10 = local_5758;
      Eigen::internal::
      Assignment<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_Eigen::Solve<Eigen::HouseholderQR<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
      ::run((Matrix<double,__1,_1,_0,__1,_1> *)&local_54c8,&local_57c8,
            (assign_op<double,_double> *)&local_5808);
      free((void *)local_5638[0].C.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                   m_storage.m_data.array[2]);
      free((void *)local_5638[0].C.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                   m_storage.m_data.array[0]);
      free((void *)local_5638[0].v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                   m_storage.m_data.array[0]);
      local_5638[0].v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
      array[0] = (double)local_5558;
      local_5638[0].v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
      array[1] = dStack_5550;
      local_5638[0].v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
      array[2] = local_5548;
      local_5638[0].C.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
      array[0] = *(double *)
                  ((long)local_54c8.v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                         m_storage.m_data.array[0] + 0x18);
      local_5638[0].C.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
      array[1] = *(double *)
                  ((long)local_54c8.v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                         m_storage.m_data.array[0] + 0x20);
      local_5638[0].C.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
      array[2] = *(double *)
                  ((long)local_54c8.v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                         m_storage.m_data.array[0] + 0x28);
      local_5638[0].w.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
      array[0] = *(double *)
                  local_54c8.v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                  m_storage.m_data.array[0];
      local_5638[0].w.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
      array[1] = *(double *)
                  ((long)local_54c8.v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                         m_storage.m_data.array[0] + 8);
      local_5638[0].w.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
      array[2] = *(double *)
                  ((long)local_54c8.v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                         m_storage.m_data.array[0] + 0x10);
      local_5638[0].t.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
      array[0] = *(double *)
                  ((long)local_54c8.v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                         m_storage.m_data.array[0] + 0x30);
      local_5638[0].t.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
      array[1] = *(double *)
                  ((long)local_54c8.v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                         m_storage.m_data.array[0] + 0x38);
      local_5638[0].t.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
      array[2] = *(double *)
                  ((long)local_54c8.v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                         m_storage.m_data.array[0] + 0x40);
      local_5638[0].f = 1.0;
      local_5638[0].rd = 0.0;
      std::vector<RSSinglelinCameraPose,_std::allocator<RSSinglelinCameraPose>_>::
      emplace_back<RSSinglelinCameraPose>(local_5760,local_5638);
      free((void *)local_54c8.v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                   m_storage.m_data.array[0]);
      free(local_58f8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
           m_data);
      free(local_5888.m_data);
      lVar10 = lVar10 + 1;
    } while (lVar10 < local_5910);
  }
  free(local_5748.m_data);
  free(local_5828.m_data);
  free(local_58c8.m_data);
  free(local_5868.m_data);
  free(local_56b8[0]);
  free(local_56a0);
  if (pvVar17 != (void *)0x0) {
    operator_delete(pvVar17);
  }
  free(local_5848);
  free(local_58e8.m_data);
  return 0;
}

Assistant:

int r6pSingleLin(const  Eigen::MatrixXd & X, const  Eigen::MatrixXd & u, const Eigen::MatrixXd & ud, int direction, double r0, int maxpow, RSSinglelinCameraPoseVector * results) {
	Eigen::VectorXd coeffs(1260);
	Eigen::MatrixXd CC = Eigen::MatrixXd::Zero(99, 163);

	double solver_input[2475];

	std::vector<Eigen::Vector3d> v;

	if (direction == 0) {
		R6P_cayley_linearized_prepare_data_C(X.data(), u.data(), ud.data(), r0, solver_input);
	}
	else {
		R6P_cayley_linearized_prepare_data_y_C(X.data(), u.data(), ud.data(), r0, solver_input);
	}

	Eigen::Map<Eigen::MatrixXd> data(solver_input, 15, 165);

	for (int j = 0; j < 15; j++)
	{
		data.row(j) /= data.row(j).cwiseAbs().mean();
	}

	computeCoeffs(data, coeffs);
	setupEliminationTemplate(coeffs, CC);

	Eigen::MatrixXd C0 = CC.leftCols(99);
	Eigen::MatrixXd C1 = CC.rightCols(64);
	

	Eigen::MatrixXd alpha = C0.partialPivLu().solve(C1);

	Eigen::MatrixXd RR(85, 64);
	for (int j = 0; j < 21; j++)
	{
		RR.row(j) = -alpha.row(78 + j);
	}


	RR.bottomRows(64) = Eigen::MatrixXd::Identity(64, 64);

	int AM_ind[] = { 78, 55, 40, 32, 28, 0, 1, 2, 31, 3, 4, 33, 5, 38, 37, 6, 7, 39, 8, 41, 42, 43, 9, 51, 49, 48, 10, 11, 50, 12, 52, 53, 54, 13, 56, 57, 58, 59, 14, 73, 69, 66, 65, 15, 16, 67, 68, 17, 70, 71, 72, 18, 74, 75, 76, 77, 19, 79, 80, 81, 82, 83, 84, 20 };
	Eigen::MatrixXd AM(64, 64);
	for (int j = 0; j < 64; j++)
	{
		AM.row(j) = RR.row(AM_ind[j]);
	}

	double p[65];
	charpoly_danilevsky(AM, p);


	int order = 64;
	double proots[65];
	double roots[64];
	int nroots;
	for (int j = 0; j <= order; j++) {
		proots[order - j] = p[j];
	}
	find_real_roots_sturm(proots, order, roots, &nroots, maxpow, 0);


	Eigen::MatrixXcd sols(3, nroots);

	v = solve_xy_from_AM(roots, nroots, AM);


	for (int j = 0; j < nroots; j++)
	{

		Eigen::Matrix3d R;
		Eigen::Vector4d q;
		q(0) = 1;
		q.segment(1, 3) = v[j];
		q.normalize();
		quat2R(q, R);

		Eigen::AngleAxis<double> eaxn = Eigen::AngleAxis<double>(R);

		Eigen::Vector3d eax = eaxn.axis()*eaxn.angle();
		//std::cout << R;
		Eigen::MatrixXd A(18, 9);
		Eigen::VectorXd b(18);
		for (int k = 0; k < 6; k++)
		{
			double dr = u(k * 2 + direction) - r0;
			Eigen::Matrix<double, 3, 9> temp;
			temp << -dr*X_(R*Eigen::Vector3d(X(k * 3), X(k * 3 + 1), X(k * 3 + 2))), Eigen::Matrix3d::Identity(), dr*Eigen::Matrix3d::Identity();

			A.block(k * 3, 0, 3, 9) = X_(Eigen::Vector3d(u(k * 2), u(k * 2 + 1), 1))*temp;

			b.segment(k * 3, 3) = -X_(Eigen::Vector3d(u(k * 2), u(k * 2 + 1), 1))*R*Eigen::Vector3d(X(k * 3), X(k * 3 + 1), X(k * 3 + 2));

		}

		Eigen::VectorXd wCt = A.householderQr().solve(b);


		results->push_back({eax, wCt.segment(3,3), wCt.segment(0,3), wCt.segment(6,3), 1, 0});

	}


	return 0;

}